

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::load_from_file
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  istream *piVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  vector<double,_std::allocator<double>_> line_of_heat_map;
  string temp;
  double point;
  ifstream in;
  int aiStack_3a0 [122];
  stringstream lineSS;
  ostream local_1a8 [16];
  int aiStack_198 [90];
  
  std::ifstream::ifstream(&in);
  std::ifstream::open((char *)&in,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_3a0 + *(long *)(_in + -0x18)) == 0) {
    piVar1 = std::istream::_M_extract<double>((double *)&in);
    std::istream::_M_extract<double>((double *)piVar1);
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&temp);
    while (*(int *)((long)aiStack_3a0 + *(long *)(_in + -0x18)) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&temp)
      ;
      std::__cxx11::stringstream::stringstream((stringstream *)&lineSS);
      std::operator<<(local_1a8,(string *)&temp);
      line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while (*(int *)((long)aiStack_198 + *(long *)(_lineSS + -0x18)) == 0) {
        std::istream::_M_extract<double>((double *)&lineSS);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>,&point);
      }
      if (*(int *)((long)aiStack_3a0 + *(long *)(_in + -0x18)) == 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&this->heat_map,
                    (value_type *)
                    &line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>);
      std::__cxx11::stringstream::~stringstream((stringstream *)&lineSS);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&temp);
    std::ifstream::~ifstream(&in);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"The file : ");
  poVar2 = std::operator<<(poVar2,filename);
  std::operator<<(poVar2," do not exist. The program will now terminate \n");
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "The persistence landscape file do not exist. The program will now terminate \n";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::load_from_file(const char* filename) {
  bool dbg = false;

  std::ifstream in;
  in.open(filename);

  // checking if the file exist / if it was open.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  // now we read the file one by one.

  in >> this->min_ >> this->max_;
  if (dbg) {
    std::clog << "Reading the following values of min and max : " << this->min_ << " , " << this->max_ << std::endl;
  }

  std::string temp;
  std::getline(in, temp);
  while (in.good()) {
    std::getline(in, temp);
    std::stringstream lineSS;
    lineSS << temp;

    std::vector<double> line_of_heat_map;
    while (lineSS.good()) {
      double point;

      lineSS >> point;
      line_of_heat_map.push_back(point);
      if (dbg) {
        std::clog << point << " ";
      }
    }
    if (dbg) {
      std::clog << std::endl;
      getchar();
    }

    if (in.good()) this->heat_map.push_back(line_of_heat_map);
  }
  in.close();
  if (dbg) std::clog << "Done \n";
}